

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingQueryInternal
          (ClientContext *this,ClientContextLock *lock,shared_ptr<duckdb::Relation,_true> *relation,
          bool allow_stream_result)

{
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var1;
  int iVar2;
  Relation *pRVar3;
  pointer pSVar4;
  undefined7 in_register_00000009;
  shared_ptr<duckdb::Relation,_true> *this_00;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> statement;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_b8;
  undefined1 local_b0 [8];
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_a8 [2];
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_98;
  undefined1 local_90 [8];
  string query;
  string local_68 [32];
  string local_48;
  
  this_00 = (shared_ptr<duckdb::Relation,_true> *)CONCAT71(in_register_00000009,allow_stream_result)
  ;
  InitialCleanup((ClientContext *)lock,(ClientContextLock *)relation);
  query._M_dataplus._M_p = (pointer)&query.field_2;
  query._M_string_length = 0;
  query.field_2._M_local_buf[0] = '\0';
  if (*(char *)&lock[0x1c].client_guard._M_device == '\x01') {
    pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(this_00);
    Relation::ToString_abi_cxx11_(&local_48,pRVar3);
    ::std::__cxx11::string::~string((string *)&local_48);
    pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(this_00);
    (*pRVar3->_vptr_Relation[5])(local_68,pRVar3);
    ::std::__cxx11::string::~string(local_68);
    pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(this_00);
    iVar2 = (*pRVar3->_vptr_Relation[8])(pRVar3);
    if ((char)iVar2 != '\0') {
      make_uniq<duckdb::SelectStatement>();
      pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(this_00);
      (*pRVar3->_vptr_Relation[3])(&local_b8,pRVar3);
      pSVar4 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
               ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                             *)local_a8);
      statement._M_head_impl = local_b8._M_head_impl;
      local_b8._M_head_impl = (QueryNode *)0x0;
      _Var1._M_head_impl =
           (pSVar4->node).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pSVar4->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = statement._M_head_impl;
      if (_Var1._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_QueryNode + 8))();
        if (local_b8._M_head_impl != (QueryNode *)0x0) {
          (*(local_b8._M_head_impl)->_vptr_QueryNode[1])();
        }
      }
      local_98._M_head_impl = local_a8[0]._M_head_impl;
      local_a8[0]._M_head_impl = (SelectStatement *)0x0;
      RunStatementInternal
                ((ClientContext *)local_90,lock,(string *)relation,
                 (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  *)statement._M_head_impl,SUB81(&local_98,0),
                 (optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
                  )0x0,false);
      if (local_90 != (undefined1  [8])0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_90)->__weak_this_).
                    internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)();
      }
      local_90 = (undefined1  [8])0x0;
      if (local_98._M_head_impl != (SelectStatement *)0x0) {
        (*((local_98._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
      }
      if (local_a8[0]._M_head_impl != (SelectStatement *)0x0) {
        (*((local_a8[0]._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
      }
    }
  }
  make_uniq<duckdb::RelationStatement,duckdb::shared_ptr<duckdb::Relation,true>const&>
            ((duckdb *)&local_b8,this_00);
  local_b0 = (undefined1  [8])local_b8._M_head_impl;
  local_a8[0]._M_head_impl = (SelectStatement *)0x0;
  local_b8._M_head_impl = (QueryNode *)0x0;
  PendingQueryInternal
            (this,lock,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             relation,(PendingQueryParameters *)local_b0,SUB81(local_a8,0));
  if (local_b0 != (undefined1  [8])0x0) {
    (*(code *)((_Hashtable *)local_b0)->_M_buckets[1])();
  }
  local_b0 = (undefined1  [8])0x0;
  if (local_b8._M_head_impl != (QueryNode *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_QueryNode[1])();
  }
  ::std::__cxx11::string::~string((string *)&query);
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingQueryInternal(ClientContextLock &lock,
                                                                   const shared_ptr<Relation> &relation,
                                                                   bool allow_stream_result) {
	InitialCleanup(lock);

	string query;
	if (config.query_verification_enabled) {
		// run the ToString method of any relation we run, mostly to ensure it doesn't crash
		relation->ToString();
		relation->GetAlias();
		if (relation->IsReadOnly()) {
			// verify read only statements by running a select statement
			auto select = make_uniq<SelectStatement>();
			select->node = relation->GetQueryNode();
			RunStatementInternal(lock, query, std::move(select), false, nullptr);
		}
	}

	auto relation_stmt = make_uniq<RelationStatement>(relation);
	PendingQueryParameters parameters;
	parameters.allow_stream_result = allow_stream_result;
	return PendingQueryInternal(lock, std::move(relation_stmt), parameters);
}